

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O2

Amount cfd::core::operator*(Amount *amount,int64_t value)

{
  Amount AVar1;
  Amount local_18;
  
  AVar1 = Amount::CreateBySatoshiAmount(amount->amount_);
  local_18.amount_ = AVar1.amount_;
  local_18.ignore_check_ = AVar1.ignore_check_;
  AVar1 = Amount::operator*=(&local_18,value);
  return AVar1;
}

Assistant:

Amount operator*(const Amount& amount, const int64_t value) {
  return Amount::CreateBySatoshiAmount(amount.GetSatoshiValue()) *= value;
}